

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall MidiInApi::setCallback(MidiInApi *this,RtMidiCallback callback,void *userData)

{
  string *psVar1;
  string *psVar2;
  string sStack_58;
  string local_38;
  
  psVar2 = &sStack_58;
  if ((this->inputData_).usingCallback == true) {
    psVar2 = &(this->super_MidiApi).errorString_;
    std::__cxx11::string::assign((char *)psVar2);
    std::__cxx11::string::string((string *)&local_38,(string *)psVar2);
    MidiApi::error(&this->super_MidiApi,WARNING,&local_38);
    psVar2 = &local_38;
  }
  else {
    if (callback != (RtMidiCallback)0x0) {
      (this->inputData_).userCallback = callback;
      (this->inputData_).userData = userData;
      (this->inputData_).usingCallback = true;
      return;
    }
    psVar1 = &(this->super_MidiApi).errorString_;
    std::__cxx11::string::assign((char *)psVar1);
    std::__cxx11::string::string((string *)&sStack_58,(string *)psVar1);
    MidiApi::error(&this->super_MidiApi,WARNING,&sStack_58);
  }
  std::__cxx11::string::~string((string *)psVar2);
  return;
}

Assistant:

void MidiInApi :: setCallback( RtMidiIn::RtMidiCallback callback, void *userData )
{
  if ( inputData_.usingCallback ) {
    errorString_ = "MidiInApi::setCallback: a callback function is already set!";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }

  if ( !callback ) {
    errorString_ = "RtMidiIn::setCallback: callback function value is invalid!";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }

  inputData_.userCallback = callback;
  inputData_.userData = userData;
  inputData_.usingCallback = true;
}